

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

ggml_tensor * __thiscall
llama_context::build_rope_shift
          (llama_context *this,ggml_context *ctx0,ggml_tensor *cur,ggml_tensor *shift,
          ggml_tensor *factors,float freq_base,float freq_scale,ggml_backend_buffer *bbuf)

{
  long lVar1;
  ggml_tensor *pgVar2;
  bool bVar3;
  ulong uVar4;
  pointer pgVar5;
  undefined8 uVar6;
  pointer pgVar7;
  undefined8 in_RCX;
  undefined4 *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  long in_R9;
  undefined4 in_XMM0_Da;
  float fVar8;
  float in_XMM1_Da;
  unique_ptr<ggml_backend,_ggml_backend_deleter> *backend;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
  *__range3;
  ggml_tensor *tmp;
  float yarn_attn_factor;
  llama_rope_type *rope_type;
  uint32_t *n_rot;
  llama_hparams *hparams;
  float *yarn_beta_slow;
  float *yarn_beta_fast;
  float *yarn_ext_factor;
  uint32_t *n_ctx_orig;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  __normal_iterator<const_std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
  *in_stack_ffffffffffffff30;
  float local_ac;
  __normal_iterator<const_std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
  local_90;
  long *local_88;
  ggml_tensor *local_80;
  float local_74;
  undefined4 *local_70;
  undefined4 *local_68;
  long local_60;
  long *local_58;
  undefined4 *local_50;
  undefined4 *local_48;
  long *local_40;
  long local_38;
  float local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 *local_18;
  undefined8 local_10;
  
  local_40 = in_RDI + 5;
  local_48 = (undefined4 *)((long)in_RDI + 0x2c);
  local_50 = (undefined4 *)((long)in_RDI + 0x34);
  local_58 = in_RDI + 7;
  lVar1 = *in_RDI;
  local_60 = lVar1 + 0x28;
  local_68 = (undefined4 *)(lVar1 + 0x3c);
  local_70 = (undefined4 *)(lVar1 + 0x1950);
  local_38 = in_R9;
  local_30 = in_XMM1_Da;
  local_2c = in_XMM0_Da;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (*(int *)(*in_RDI + 4) == 0x2f) {
    fVar8 = logf(1.0 / in_XMM1_Da);
    local_ac = 1.0 / (fVar8 * 0.1 + 1.0);
  }
  else {
    local_ac = *(float *)(in_RDI + 6);
  }
  local_74 = local_ac;
  uVar4 = ggml_is_quantized(*local_18);
  if ((uVar4 & 1) == 0) {
    local_80 = (ggml_tensor *)
               ggml_rope_ext_inplace
                         (local_2c,local_30,*local_48,local_74,*local_50,(int)*local_58,local_10,
                          local_18,local_20,local_28,*local_68,*local_70,(int)*local_40);
  }
  else {
    local_80 = (ggml_tensor *)ggml_cast(local_10,local_18,0);
    if (local_38 != 0) {
      local_88 = in_RDI + 0x56;
      local_90._M_current =
           (unique_ptr<ggml_backend,_ggml_backend_deleter> *)
           std::
           vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
           ::begin((vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      std::
      vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
      ::end((vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
             *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      while (bVar3 = __gnu_cxx::operator!=
                               (in_stack_ffffffffffffff30,
                                (__normal_iterator<const_std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)),
            bVar3) {
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
        ::operator*(&local_90);
        pgVar5 = std::unique_ptr<ggml_backend,_ggml_backend_deleter>::get
                           ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)
                            in_stack_ffffffffffffff30);
        uVar6 = ggml_backend_buffer_get_type(local_38);
        uVar4 = ggml_backend_supports_buft(pgVar5,uVar6);
        if ((uVar4 & 1) != 0) {
          pgVar7 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                             ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
                              in_stack_ffffffffffffff30);
          pgVar2 = local_80;
          pgVar5 = std::unique_ptr<ggml_backend,_ggml_backend_deleter>::get
                             ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)
                              in_stack_ffffffffffffff30);
          ggml_backend_sched_set_tensor_backend(pgVar7,pgVar2,pgVar5);
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
        ::operator++(&local_90);
      }
    }
    local_80 = (ggml_tensor *)
               ggml_rope_ext_inplace
                         (local_2c,local_30,*local_48,local_74,*local_50,(int)*local_58,local_10,
                          local_80,local_20,local_28,*local_68,*local_70,(int)*local_40);
    local_80 = (ggml_tensor *)ggml_cpy(local_10,local_80,local_18);
  }
  return local_80;
}

Assistant:

ggml_tensor * llama_context::build_rope_shift(
        ggml_context * ctx0,
        ggml_tensor * cur,
        ggml_tensor * shift,
        ggml_tensor * factors,
              float   freq_base,
              float   freq_scale,
        ggml_backend_buffer * bbuf) const {
    const auto & n_ctx_orig = cparams.n_ctx_orig_yarn;

    const auto & yarn_ext_factor  = cparams.yarn_ext_factor;
    const auto & yarn_beta_fast   = cparams.yarn_beta_fast;
    const auto & yarn_beta_slow   = cparams.yarn_beta_slow;

    const auto & hparams = model.hparams;

    const auto & n_rot     = hparams.n_rot;
    const auto & rope_type = hparams.rope_type;

    // See llm_build_deepseek2() for why attn_factor has to be scaled for YaRN RoPE to work correctly.
    // See https://github.com/ggerganov/llama.cpp/discussions/7416 for detailed explanation.
    const float yarn_attn_factor = model.arch == LLM_ARCH_DEEPSEEK2 ? 1.0f / (1.0f + 0.1f * logf(1.0f / freq_scale)) : cparams.yarn_attn_factor;

    ggml_tensor * tmp;

    if (ggml_is_quantized(cur->type)) {
        // dequantize to f32 -> RoPE -> quantize back
        tmp = ggml_cast(ctx0, cur, GGML_TYPE_F32);

        if (bbuf) {
            for (const auto & backend : backends) {
                // Figure out which backend KV cache belongs to
                if (ggml_backend_supports_buft(backend.get(), ggml_backend_buffer_get_type(bbuf))) {
                    ggml_backend_sched_set_tensor_backend(sched.get(), tmp, backend.get());
                    break;
                }
            }
        }

        tmp = ggml_rope_ext_inplace(ctx0, tmp,
                shift, factors, n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                yarn_ext_factor, yarn_attn_factor, yarn_beta_fast, yarn_beta_slow);

        tmp = ggml_cpy(ctx0, tmp, cur);
    } else {
        // we rotate only the first n_rot dimensions
        tmp = ggml_rope_ext_inplace(ctx0, cur,
                shift, factors, n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                yarn_ext_factor, yarn_attn_factor, yarn_beta_fast, yarn_beta_slow);
    }

    return tmp;
}